

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::ClipperBase::UpdateEdgeIntoAEL(ClipperBase *this,TEdge **e)

{
  double dVar1;
  TEdge *pTVar2;
  TEdge *pTVar3;
  TEdge *pTVar4;
  ClipperBase *pCVar5;
  cInt cVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  clipperException *this_00;
  ClipperBase *pCVar10;
  cInt local_18;
  
  pTVar2 = *e;
  pTVar3 = pTVar2->NextInLML;
  if (pTVar3 != (TEdge *)0x0) {
    pTVar3->OutIdx = pTVar2->OutIdx;
    pTVar4 = pTVar2->NextInAEL;
    pCVar5 = (ClipperBase *)pTVar2->PrevInAEL;
    pCVar10 = pCVar5;
    if (pCVar5 == (ClipperBase *)0x0) {
      pCVar10 = this;
    }
    pCVar10->m_ActiveEdges = pTVar3;
    if (pTVar4 != (TEdge *)0x0) {
      pTVar4->PrevInAEL = (*e)->NextInLML;
    }
    pTVar2 = *e;
    pTVar3 = pTVar2->NextInLML;
    iVar7 = pTVar2->WindDelta;
    iVar8 = pTVar2->WindCnt;
    iVar9 = pTVar2->WindCnt2;
    pTVar3->Side = pTVar2->Side;
    pTVar3->WindDelta = iVar7;
    pTVar3->WindCnt = iVar8;
    pTVar3->WindCnt2 = iVar9;
    *e = pTVar3;
    cVar6 = (pTVar3->Bot).Y;
    (pTVar3->Curr).X = (pTVar3->Bot).X;
    (pTVar3->Curr).Y = cVar6;
    (*e)->PrevInAEL = (TEdge *)pCVar5;
    (*e)->NextInAEL = pTVar4;
    dVar1 = (*e)->Dx;
    if ((dVar1 != -1e+40) || (NAN(dVar1))) {
      local_18 = ((*e)->Top).Y;
      std::
      priority_queue<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<long_long>_>
      ::push(&this->m_Scanbeam,&local_18);
    }
    return;
  }
  this_00 = (clipperException *)__cxa_allocate_exception(0x28);
  clipperException::clipperException(this_00,"UpdateEdgeIntoAEL: invalid call");
  __cxa_throw(this_00,&clipperException::typeinfo,clipperException::~clipperException);
}

Assistant:

void ClipperBase::UpdateEdgeIntoAEL(TEdge *&e)
{
  if (!e->NextInLML) 
    throw clipperException("UpdateEdgeIntoAEL: invalid call");

  e->NextInLML->OutIdx = e->OutIdx;
  TEdge* AelPrev = e->PrevInAEL;
  TEdge* AelNext = e->NextInAEL;
  if (AelPrev) AelPrev->NextInAEL = e->NextInLML;
  else m_ActiveEdges = e->NextInLML;
  if (AelNext) AelNext->PrevInAEL = e->NextInLML;
  e->NextInLML->Side = e->Side;
  e->NextInLML->WindDelta = e->WindDelta;
  e->NextInLML->WindCnt = e->WindCnt;
  e->NextInLML->WindCnt2 = e->WindCnt2;
  e = e->NextInLML;
  e->Curr = e->Bot;
  e->PrevInAEL = AelPrev;
  e->NextInAEL = AelNext;
  if (!IsHorizontal(*e)) InsertScanbeam(e->Top.Y);
}